

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache.h
# Opt level: O2

void __thiscall
CuckooCache::cache<uint256,_SignatureCacheHasher>::cache(cache<uint256,_SignatureCacheHasher> *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)
   ((long)&(this->table).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->table).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->table).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->table).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bit_packed_atomic_flags::bit_packed_atomic_flags(&this->collection_flags,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (this->epoch_flags).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    this->epoch_heuristic_counter = 0;
    this->epoch_size = 0;
    (this->epoch_flags).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    *(undefined8 *)
     &(this->epoch_flags).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    (this->epoch_flags).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    *(undefined8 *)
     &(this->epoch_flags).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    this->depth_limit = '\0';
    return;
  }
  __stack_chk_fail();
}

Assistant:

cache() : table(), collection_flags(0), epoch_flags(), hash_function()
    {
    }